

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall
GeometryPass::execute
          (GeometryPass *this,vector<Object,_std::allocator<Object>_> *objects,mat4 clip_from_world,
          TextureLoader *loader)

{
  undefined8 uVar1;
  QueueItem *pQVar2;
  bool bVar3;
  uint uVar4;
  atomic<unsigned_long> *paVar5;
  atomic<unsigned_long> *paVar6;
  uint8_t *puVar7;
  float *pfVar8;
  reference __src;
  ImageTexture *pIVar9;
  GpuCtxWrapper *pGVar10;
  ExplicitProducer *pEVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  mat4 local_774;
  allocator<char> local_731;
  string local_730;
  size_t local_710;
  size_t local_708;
  uint local_700;
  uint uStack_6fc;
  undefined1 local_6f8 [8];
  Object obj;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Object,_std::allocator<Object>_> *__range1;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  GLScopedDebugGroup local_54d [19];
  byte local_53a;
  byte local_539;
  GpuCtxScope ___tracy_gpu_zone;
  TextureLoader *pTStack_538;
  ScopedZone ___tracy_scoped_zone;
  TextureLoader *loader_local;
  vector<Object,_std::allocator<Object>_> *objects_local;
  GeometryPass *this_local;
  QueueItem *item;
  atomic<unsigned_long> *__tail;
  ExplicitProducer *__token;
  index_t __magic;
  SourceLocationData *local_4f8;
  byte *local_4f0;
  QueueItem *local_4e8;
  QueueItem *item_1;
  atomic<unsigned_long> *__tail_1;
  ExplicitProducer *__token_1;
  index_t __magic_1;
  uint queryId;
  byte *local_4b8;
  QueueItem *local_4b0;
  QueueItem *item_2;
  atomic<unsigned_long> *__tail_2;
  ExplicitProducer *__token_2;
  index_t __magic_2;
  byte *pbStack_488;
  uint queryId_1;
  QueueItem *item_4;
  atomic<unsigned_long> *__tail_4;
  ExplicitProducer *__token_4;
  index_t __magic_4;
  uint queryId_2;
  QueueItem *local_450;
  QueueItem *item_3;
  atomic<unsigned_long> *__tail_3;
  ExplicitProducer *__token_3;
  index_t __magic_3;
  QueueItem *item_5;
  atomic<unsigned_long> *__tail_5;
  ExplicitProducer *__token_5;
  index_t __magic_5;
  ExplicitProducer *local_3f8;
  ExplicitProducer *local_3e8;
  ExplicitProducer *local_3e0;
  ExplicitProducer *local_3d8;
  ExplicitProducer **local_3c0;
  ExplicitProducer *local_3b8;
  ExplicitProducer **local_3a0;
  ExplicitProducer *local_398;
  ExplicitProducer **local_390;
  ExplicitProducer *local_388;
  ExplicitProducer **local_380;
  ExplicitProducer *local_378;
  undefined1 local_359;
  QueueItem *local_358;
  undefined1 local_339;
  QueueItem *local_338;
  undefined1 local_329;
  QueueItem *local_328;
  undefined1 local_319;
  QueueItem *local_318;
  long local_300;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2f8;
  long local_2e0;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2d8;
  long local_2d0;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2c8;
  long local_2c0;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2b8;
  uint64_t rdx_5;
  uint64_t rax_5;
  uint64_t rdx_3;
  uint64_t rax_3;
  uint64_t rdx_4;
  uint64_t rax_4;
  uint64_t rdx_2;
  uint64_t rax_2;
  uint64_t rdx_1;
  uint64_t rax_1;
  uint64_t rdx;
  uint64_t rax;
  undefined8 *local_248;
  SourceLocationData *local_240;
  uint64_t *local_238;
  memory_order __b_11;
  int local_204;
  memory_order __b_7;
  QueueItem *local_1f8;
  memory_order __b_9;
  undefined1 *local_1d0;
  memory_order local_1c8;
  int local_1c4;
  memory_order __b_5;
  QueueItem *local_1b8;
  undefined1 *local_1b0;
  memory_order local_1a8;
  int local_1a4;
  memory_order __b_3;
  QueueItem *local_198;
  undefined1 *local_190;
  memory_order local_188;
  int local_184;
  memory_order __b_1;
  atomic<unsigned_long> *local_178;
  ExplicitProducer *local_170;
  memory_order local_168;
  int local_164;
  memory_order __b;
  ExplicitProducer *local_158;
  memory_order local_150;
  int local_14c;
  memory_order __b_2;
  ExplicitProducer *local_140;
  memory_order local_138;
  int local_134;
  memory_order __b_4;
  memory_order __b_8;
  ExplicitProducer *local_110;
  memory_order local_108;
  int local_104;
  memory_order __b_6;
  memory_order __b_10;
  uint id_2;
  uint local_cc;
  GpuCtx *pGStack_c8;
  uint id_1;
  uint local_bc;
  GpuCtx *pGStack_b8;
  uint id;
  uint local_9c;
  GpuCtx *local_98;
  uint local_8c;
  GpuCtx *local_88;
  uint16_t local_6a;
  uint16_t *local_68;
  uint16_t local_5a;
  uint16_t *local_58;
  uint8_t local_39;
  uint8_t *local_38;
  uint8_t local_29;
  uint8_t *local_28;
  GpuCtx *local_18;
  GpuCtx *local_10;
  
  local_4f0 = &local_539;
  local_4f8 = &execute::__tracy_source_location183;
  __magic._7_1_ = 1;
  local_539 = 1;
  pTStack_538 = loader;
  pEVar11 = tracy::GetToken();
  paVar5 = &(pEVar11->super_ProducerBase).tailIndex;
  local_380 = &__token;
  paVar6 = &(pEVar11->super_ProducerBase).tailIndex;
  local_164 = 0;
  local_3d8 = pEVar11;
  local_378 = pEVar11;
  ___b = paVar6;
  local_168 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_164 - 1U < 2) {
    local_170 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_164 == 5) {
    local_170 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_170 = (ExplicitProducer *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
  }
  *local_380 = local_170;
  bVar3 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_380 & 0xffff) == 0);
  if (bVar3) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar11,(index_t)*local_380);
  }
  local_318 = tracy::moodycamel::
              ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
              Block::operator[]((pEVar11->super_ProducerBase).tailBlock,(index_t)*local_380);
  local_319 = 0xf;
  (local_318->hdr).field_0.type = ZoneBegin;
  local_2b8 = &local_318->field_1;
  uVar1 = rdtsc();
  rax_1 = CONCAT44(extraout_var,(int)((ulong)uVar1 >> 0x20));
  rdx = CONCAT44((int)((ulong)local_318 >> 0x20),(int)uVar1);
  local_2c0 = (rax_1 << 0x20) + rdx;
  (local_2b8->frameMark).time = local_2c0;
  local_238 = &(local_318->field_1).zoneBegin.srcloc;
  local_240 = local_4f8;
  *local_238 = (uint64_t)local_4f8;
  ___b_1 = (undefined1 *)((long)&(__token->super_ProducerBase)._vptr_ProducerBase + 1);
  local_184 = 3;
  local_178 = paVar5;
  local_188 = std::operator&(memory_order_release,__memory_order_mask);
  if (local_184 == 3) {
    (paVar5->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
  }
  else if (local_184 == 5) {
    LOCK();
    (paVar5->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
    UNLOCK();
  }
  else {
    (paVar5->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
  }
  local_190 = ___b_1;
  local_4b8 = &local_53a;
  _queryId = &execute::__tracy_gpu_source_location184;
  __magic_1._7_1_ = 1;
  local_53a = 1;
  pGVar10 = tracy::GetGpuCtx();
  pGStack_b8 = pGVar10->ptr;
  __magic_1._0_4_ = pGStack_b8->m_head;
  pGStack_b8->m_head = pGStack_b8->m_head + 1 & 0xffff;
  uVar1 = gl3wProcs.ptr[0x1b1];
  local_bc = (uint)__magic_1;
  if (pGStack_b8->m_head == pGStack_b8->m_tail) {
    __assert_fail("m_head != m_tail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/TracyOpenGL.hpp"
                  ,0xb4,"unsigned int tracy::GpuCtx::NextQueryId()");
  }
  pGVar10 = tracy::GetGpuCtx();
  local_88 = pGVar10->ptr;
  local_8c = (uint)__magic_1;
  (*(code *)uVar1)((ulong)local_88->m_query[(uint)__magic_1],0x8e28);
  pEVar11 = tracy::GetToken();
  item_1 = (QueueItem *)&(pEVar11->super_ProducerBase).tailIndex;
  local_390 = &__token_1;
  paVar5 = &(pEVar11->super_ProducerBase).tailIndex;
  local_14c = 0;
  __tail_1 = (atomic<unsigned_long> *)pEVar11;
  local_3e0 = pEVar11;
  local_388 = pEVar11;
  ___b_2 = paVar5;
  local_150 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_14c - 1U < 2) {
    local_158 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_14c == 5) {
    local_158 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_158 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
  }
  *local_390 = local_158;
  bVar3 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_390 & 0xffff) == 0);
  if (bVar3) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar11,(index_t)*local_390);
  }
  local_4e8 = tracy::moodycamel::
              ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
              Block::operator[]((pEVar11->super_ProducerBase).tailBlock,(index_t)*local_390);
  local_329 = 0x21;
  (local_4e8->hdr).field_0.type = GpuZoneBegin;
  local_2c8 = &local_4e8->field_1;
  uVar1 = rdtsc();
  rax_2 = CONCAT44(extraout_var_00,(int)((ulong)uVar1 >> 0x20));
  rdx_1 = CONCAT44((int)((ulong)local_4e8 >> 0x20),(int)uVar1);
  local_2d0 = (rax_2 << 0x20) + rdx_1;
  (local_2c8->frameMark).time = local_2d0;
  (local_4e8->field_1).zoneEndThread.thread = 0;
  local_58 = &(local_4e8->field_1).lockNameFat.size;
  local_5a = (uint16_t)__magic_1;
  *local_58 = (uint16_t)__magic_1;
  puVar7 = &(local_4e8->field_1).gpuZoneBeginLean.context;
  local_328 = local_4e8;
  pGVar10 = tracy::GetGpuCtx();
  pQVar2 = item_1;
  local_10 = pGVar10->ptr;
  local_29 = local_10->m_context;
  *puVar7 = local_29;
  local_248 = (undefined8 *)((long)&(local_4e8->field_1).zoneBegin.srcloc + 7);
  rax = (uint64_t)_queryId;
  *local_248 = _queryId;
  ___b_3 = (undefined1 *)((long)&(__token_1->super_ProducerBase)._vptr_ProducerBase + 1);
  local_198 = item_1;
  local_1a4 = 3;
  local_28 = puVar7;
  local_1a8 = std::operator&(memory_order_release,__memory_order_mask);
  if (local_1a4 == 3) {
    *(undefined1 **)pQVar2 = ___b_3;
  }
  else if (local_1a4 == 5) {
    LOCK();
    *(undefined1 **)pQVar2 = ___b_3;
    UNLOCK();
  }
  else {
    *(undefined1 **)pQVar2 = ___b_3;
  }
  local_1b0 = ___b_3;
  GLScopedDebugGroup::GLScopedDebugGroup(local_54d,"Geometry pass");
  GLScopedDebugGroup::~GLScopedDebugGroup(local_54d);
  (*gl3wProcs.ptr[0x96])(0xb71);
  (*gl3wProcs.ptr[0xf])(0x8d40,(ulong)this->fbo);
  (*gl3wProcs.ptr[0x35])(0,0,0);
  (*gl3wProcs.ptr[0x2e])(0x4100);
  uVar1 = gl3wProcs.ptr[0x22f];
  uVar4 = Shader::id(&this->program);
  (*(code *)uVar1)((ulong)uVar4);
  uVar1 = gl3wProcs.ptr[0x227];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"viewproj",&local_571);
  uVar4 = Shader::getLoc(&this->program,&local_570);
  pfVar8 = glm::value_ptr<float,(glm::precision)0>(&clip_from_world);
  (*(code *)uVar1)((ulong)uVar4,1,0,pfVar8);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  uVar1 = gl3wProcs.ptr[0x1fd];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"albedoMap",&local_599);
  uVar4 = Shader::getLoc(&this->program,&local_598);
  (*(code *)uVar1)((ulong)uVar4,0);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  uVar1 = gl3wProcs.ptr[0x1fd];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"roughnessMetallicMap",&local_5c1);
  uVar4 = Shader::getLoc(&this->program,&local_5c0);
  (*(code *)uVar1)((ulong)uVar4,1);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  uVar1 = gl3wProcs.ptr[0x1fd];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"normalMap",(allocator<char> *)((long)&__range1 + 7));
  uVar4 = Shader::getLoc(&this->program,&local_5e8);
  (*(code *)uVar1)((ulong)uVar4,2);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = std::vector<Object,_std::allocator<Object>_>::begin(objects);
  obj.aabb.points[7].field_0._4_8_ = std::vector<Object,_std::allocator<Object>_>::end(objects);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_>
                                     *)((long)&obj.aabb.points[7].field_0 + 4)), bVar3) {
    __src = __gnu_cxx::
            __normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_>::
            operator*(&__end1);
    memcpy(local_6f8,__src,0xf0);
    (*gl3wProcs.ptr[1])(0x84c0);
    uVar1 = gl3wProcs.ptr[0x16];
    local_700 = obj.mesh.numVertices;
    uStack_6fc = obj.mesh.numIndices;
    pIVar9 = TextureLoader::get(pTStack_538,(TexID)obj.mesh._8_8_);
    uVar4 = ImageTexture::id(pIVar9);
    (*(code *)uVar1)(0xde1,(ulong)uVar4);
    (*gl3wProcs.ptr[1])(0x84c1);
    uVar1 = gl3wProcs.ptr[0x16];
    local_708 = obj.material.albedoMap.id;
    pIVar9 = TextureLoader::get(pTStack_538,obj.material.albedoMap);
    uVar4 = ImageTexture::id(pIVar9);
    (*(code *)uVar1)(0xde1,(ulong)uVar4);
    (*gl3wProcs.ptr[1])(0x84c2);
    uVar1 = gl3wProcs.ptr[0x16];
    local_710 = obj.material.roughnessMetallicMap.id;
    pIVar9 = TextureLoader::get(pTStack_538,obj.material.roughnessMetallicMap);
    uVar4 = ImageTexture::id(pIVar9);
    (*(code *)uVar1)(0xde1,(ulong)uVar4);
    (*gl3wProcs.ptr[0x1a])((ulong)(uint)obj.transform.m_matrix.value[3].field_0.field_0.z);
    uVar1 = gl3wProcs.ptr[0x227];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"model",&local_731);
    uVar4 = Shader::getLoc(&this->program,&local_730);
    Transform::getMatrix(&local_774,(Transform *)local_6f8);
    pfVar8 = glm::value_ptr<float,(glm::precision)0>(&local_774);
    (*(code *)uVar1)((ulong)uVar4,1,0,pfVar8);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator(&local_731);
    (*gl3wProcs.ptr[0x89])(4,(ulong)obj.mesh.vbo,0x1405,0);
    __gnu_cxx::__normal_iterator<const_Object_*,_std::vector<Object,_std::allocator<Object>_>_>::
    operator++(&__end1);
  }
  pbStack_488 = &local_53a;
  if ((local_53a & 1) != 0) {
    pGVar10 = tracy::GetGpuCtx();
    pGStack_c8 = pGVar10->ptr;
    __magic_2._4_4_ = pGStack_c8->m_head;
    pGStack_c8->m_head = pGStack_c8->m_head + 1 & 0xffff;
    uVar1 = gl3wProcs.ptr[0x1b1];
    local_cc = __magic_2._4_4_;
    if (pGStack_c8->m_head == pGStack_c8->m_tail) {
      __assert_fail("m_head != m_tail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/TracyOpenGL.hpp"
                    ,0xb4,"unsigned int tracy::GpuCtx::NextQueryId()");
    }
    pGVar10 = tracy::GetGpuCtx();
    local_98 = pGVar10->ptr;
    local_9c = __magic_2._4_4_;
    (*(code *)uVar1)((ulong)local_98->m_query[__magic_2._4_4_],0x8e28);
    pEVar11 = tracy::GetToken();
    item_2 = (QueueItem *)&(pEVar11->super_ProducerBase).tailIndex;
    local_3a0 = &__token_2;
    paVar5 = &(pEVar11->super_ProducerBase).tailIndex;
    local_134 = 0;
    __tail_2 = (atomic<unsigned_long> *)pEVar11;
    local_3e8 = pEVar11;
    local_398 = pEVar11;
    ___b_4 = paVar5;
    local_138 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_134 - 1U < 2) {
      local_140 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_134 == 5) {
      local_140 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_140 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
    }
    *local_3a0 = local_140;
    bVar3 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_3a0 & 0xffff) == 0);
    if (bVar3) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar11,(index_t)*local_3a0);
    }
    local_4b0 = tracy::moodycamel::
                ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
                Block::operator[]((pEVar11->super_ProducerBase).tailBlock,(index_t)*local_3a0);
    local_339 = 0x25;
    (local_4b0->hdr).field_0.type = GpuZoneEnd;
    local_2d8 = &local_4b0->field_1;
    uVar1 = rdtsc();
    rax_4 = CONCAT44(extraout_var_01,(int)((ulong)uVar1 >> 0x20));
    rdx_2 = CONCAT44((int)((ulong)local_4b0 >> 0x20),(int)uVar1);
    local_2e0 = (rax_4 << 0x20) + rdx_2;
    (local_2d8->frameMark).time = local_2e0;
    (local_4b0->field_1).zoneEndThread.thread = 0;
    local_68 = &(local_4b0->field_1).lockNameFat.size;
    local_6a = __magic_2._4_2_;
    *local_68 = __magic_2._4_2_;
    puVar7 = &(local_4b0->field_1).gpuZoneBeginLean.context;
    local_338 = local_4b0;
    pGVar10 = tracy::GetGpuCtx();
    pQVar2 = item_2;
    local_18 = pGVar10->ptr;
    local_39 = local_18->m_context;
    *puVar7 = local_39;
    ___b_5 = (undefined1 *)((long)&(__token_2->super_ProducerBase)._vptr_ProducerBase + 1);
    local_1b8 = item_2;
    local_1c4 = 3;
    local_38 = puVar7;
    local_1c8 = std::operator&(memory_order_release,__memory_order_mask);
    local_1d0 = ___b_5;
    if (local_1c4 == 3) {
      *(undefined1 **)pQVar2 = ___b_5;
    }
    else if (local_1c4 == 5) {
      LOCK();
      *(undefined1 **)pQVar2 = ___b_5;
      UNLOCK();
    }
    else {
      *(undefined1 **)pQVar2 = ___b_5;
    }
  }
  __magic_3 = (index_t)&local_539;
  if ((local_539 & 1) != 0) {
    pEVar11 = tracy::GetToken();
    item_3 = (QueueItem *)&(pEVar11->super_ProducerBase).tailIndex;
    local_3c0 = &__token_3;
    paVar5 = &(pEVar11->super_ProducerBase).tailIndex;
    local_104 = 0;
    __tail_3 = (atomic<unsigned_long> *)pEVar11;
    local_3f8 = pEVar11;
    local_3b8 = pEVar11;
    ___b_6 = paVar5;
    local_108 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_104 - 1U < 2) {
      local_110 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_104 == 5) {
      local_110 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_110 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
    }
    *local_3c0 = local_110;
    bVar3 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_3c0 & 0xffff) == 0);
    if (bVar3) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar11,(index_t)*local_3c0);
    }
    local_450 = tracy::moodycamel::
                ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
                Block::operator[]((pEVar11->super_ProducerBase).tailBlock,(index_t)*local_3c0);
    pQVar2 = item_3;
    local_359 = 0x11;
    (local_450->hdr).field_0.type = ZoneEnd;
    local_2f8 = &local_450->field_1;
    uVar1 = rdtsc();
    rax_5 = CONCAT44(extraout_var_02,(int)((ulong)uVar1 >> 0x20));
    rdx_3 = CONCAT44((int)((ulong)local_450 >> 0x20),(int)uVar1);
    local_300 = (rax_5 << 0x20) + rdx_3;
    (local_2f8->frameMark).time = local_300;
    ___b_7 = (undefined1 *)((long)&(__token_3->super_ProducerBase)._vptr_ProducerBase + 1);
    local_1f8 = item_3;
    local_204 = 3;
    local_358 = local_450;
    std::operator&(memory_order_release,__memory_order_mask);
    if (local_204 == 3) {
      *(undefined1 **)pQVar2 = ___b_7;
    }
    else if (local_204 == 5) {
      LOCK();
      *(undefined1 **)pQVar2 = ___b_7;
      UNLOCK();
    }
    else {
      *(undefined1 **)pQVar2 = ___b_7;
    }
  }
  return;
}

Assistant:

void GeometryPass::execute(const std::vector<Object>& objects, glm::mat4 clip_from_world, TextureLoader* loader)
{
    ZoneScopedN("Geometry Pass");
    TracyGpuZone("Geometry pass");
    GLScopedDebugGroup("Geometry pass");

    // === GEOMETRY PASS ===
    glEnable(GL_DEPTH_TEST);
    glBindFramebuffer(GL_FRAMEBUFFER, fbo);
    glClearColor(0.0, 0.0, 0.0, 0.0);
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

    glUseProgram(program.id());
    glUniformMatrix4fv(program.getLoc("viewproj"), 1, GL_FALSE, glm::value_ptr(clip_from_world));
    glUniform1i(program.getLoc("albedoMap"), 0);
    glUniform1i(program.getLoc("roughnessMetallicMap"), 1);
    glUniform1i(program.getLoc("normalMap"), 2);

    for (auto obj : objects) {
        glActiveTexture(GL_TEXTURE0 + 0);
        glBindTexture(GL_TEXTURE_2D, loader->get(obj.material.albedoMap)->id());
        glActiveTexture(GL_TEXTURE0 + 1);
        glBindTexture(GL_TEXTURE_2D, loader->get(obj.material.roughnessMetallicMap)->id());
        glActiveTexture(GL_TEXTURE0 + 2);
        glBindTexture(GL_TEXTURE_2D, loader->get(obj.material.normalMap)->id());

        glBindVertexArray(obj.mesh.vao);
        glUniformMatrix4fv(program.getLoc("model"), 1, GL_FALSE, glm::value_ptr(obj.transform.getMatrix()));

        glDrawElements(GL_TRIANGLES, obj.mesh.numIndices, GL_UNSIGNED_INT, (void*)0);
    }
}